

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mesh_splitter.cpp
# Opt level: O2

void __thiscall
MeshSplitter::SplitMesh
          (MeshSplitter *this,uint a,aiMesh *in_mesh,
          vector<std::pair<aiMesh_*,_unsigned_int>,_std::allocator<std::pair<aiMesh_*,_unsigned_int>_>_>
          *source_mesh_map)

{
  aiColor4D *paVar1;
  aiColor4D *paVar2;
  aiVector3D *paVar3;
  pointer ppVar4;
  aiBone *paVar5;
  ulong uVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  pointer paVar22;
  pointer paVar23;
  bool bVar24;
  uint c;
  uint uVar25;
  uint uVar26;
  VertexWeightTable *pVVar27;
  aiVertexWeight this_00;
  aiBone **ppaVar28;
  pointer puVar29;
  aiVector3D *paVar30;
  void *pvVar31;
  uint *puVar32;
  aiBone *paVar33;
  aiBone *this_01;
  ulong uVar34;
  aiVertexWeight *__s;
  ulong *puVar35;
  aiFace *paVar36;
  uint uVar37;
  uint uVar38;
  aiFace *paVar39;
  int iVar40;
  uint p;
  long lVar41;
  pointer ppVar42;
  ulong uVar43;
  ulong uVar44;
  ulong uVar45;
  aiBone **local_4b0;
  vector<aiFace,_std::allocator<aiFace>_> vFaces;
  vector<unsigned_int,_std::allocator<unsigned_int>_> was_copied_to;
  undefined1 local_438 [8];
  uint *local_430;
  
  if (this->LIMIT < in_mesh->mNumVertices) {
    pVVar27 = ComputeVertexBoneWeightTable(in_mesh);
    uVar38 = in_mesh->mNumVertices;
    uVar26 = this->LIMIT;
    was_copied_to.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    was_copied_to.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    was_copied_to.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_438._0_4_ = 0xffffffff;
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::resize
              (&was_copied_to,(ulong)uVar38,(value_type_conflict1 *)local_438);
    uVar6 = (ulong)in_mesh->mNumFaces / (ulong)(uVar38 / uVar26 + 1);
    uVar38 = 0;
    do {
      uVar26 = this->LIMIT;
      this_00 = (aiVertexWeight)operator_new(0x520);
      aiMesh::aiMesh((aiMesh *)this_00);
      *(uint *)((long)this_00 + 4) = 0;
      *(uint *)((long)this_00 + 0xe8) = in_mesh->mMaterialIndex;
      if (this_00 != (aiVertexWeight)in_mesh) {
        uVar25 = (in_mesh->mName).length;
        ((aiString *)((long)this_00 + 0xec))->length = uVar25;
        memcpy((char *)((long)this_00 + 0xf0),(in_mesh->mName).data,(ulong)uVar25);
        ((char *)((long)this_00 + 0xf0))[uVar25] = '\0';
      }
      if (in_mesh->mNumBones != 0 && in_mesh->mBones != (aiBone **)0x0) {
        uVar44 = (ulong)in_mesh->mNumBones << 3;
        ppaVar28 = (aiBone **)operator_new__(uVar44);
        memset(ppaVar28,0,uVar44);
        *(aiBone ***)((long)this_00 + 0xe0) = ppaVar28;
      }
      puVar29 = was_copied_to.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                _M_impl.super__Vector_impl_data._M_start;
      if (uVar38 != 0) {
        for (; puVar29 !=
               was_copied_to.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
               .super__Vector_impl_data._M_finish; puVar29 = puVar29 + 1) {
          *puVar29 = 0xffffffff;
        }
      }
      vFaces.super__Vector_base<aiFace,_std::allocator<aiFace>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage = (pointer)0x0;
      vFaces.super__Vector_base<aiFace,_std::allocator<aiFace>_>._M_impl.super__Vector_impl_data.
      _M_start = (pointer)0x0;
      vFaces.super__Vector_base<aiFace,_std::allocator<aiFace>_>._M_impl.super__Vector_impl_data.
      _M_finish = (pointer)0x0;
      uVar25 = in_mesh->mNumVertices;
      uVar44 = (ulong)uVar26;
      if (uVar25 != 0 && in_mesh->mVertices != (aiVector3D *)0x0) {
        paVar30 = (aiVector3D *)operator_new__(uVar44 * 0xc);
        if (uVar26 != 0) {
          uVar45 = uVar44 * 0xc - 0xc;
          memset(paVar30,0,(uVar45 - uVar45 % 0xc) + 0xc);
        }
        *(aiVector3D **)((long)this_00 + 0x10) = paVar30;
      }
      if (in_mesh->mNormals != (aiVector3D *)0x0 && uVar25 != 0) {
        paVar30 = (aiVector3D *)operator_new__(uVar44 * 0xc);
        if (uVar26 != 0) {
          uVar45 = uVar44 * 0xc - 0xc;
          memset(paVar30,0,(uVar45 - uVar45 % 0xc) + 0xc);
        }
        *(aiVector3D **)((long)this_00 + 0x18) = paVar30;
      }
      bVar24 = aiMesh::HasTangentsAndBitangents(in_mesh);
      if (bVar24) {
        uVar45 = uVar44 * 0xc;
        paVar30 = (aiVector3D *)operator_new__(uVar45);
        if (uVar26 != 0) {
          memset(paVar30,0,((uVar45 - 0xc) - (uVar45 - 0xc) % 0xc) + 0xc);
        }
        *(aiVector3D **)((long)this_00 + 0x20) = paVar30;
        paVar30 = (aiVector3D *)operator_new__(uVar45);
        if (uVar26 != 0) {
          memset(paVar30,0,((uVar45 - 0xc) - (uVar45 - 0xc) % 0xc) + 0xc);
        }
        *(aiVector3D **)((long)this_00 + 0x28) = paVar30;
      }
      lVar41 = 6;
      while (((lVar41 != 0xe && (in_mesh->mColors[lVar41 + -6] != (aiColor4D *)0x0)) &&
             (in_mesh->mNumVertices != 0))) {
        pvVar31 = operator_new__(uVar44 << 4);
        if (uVar26 != 0) {
          memset(pvVar31,0,uVar44 << 4);
        }
        *(void **)((long)this_00 + lVar41 * 8) = pvVar31;
        lVar41 = lVar41 + 1;
      }
      uVar44 = uVar44 * 0xc;
      lVar41 = 0;
      while (((lVar41 != 0x20 && (*(long *)((long)in_mesh->mTextureCoords + lVar41 * 2) != 0)) &&
             (in_mesh->mNumVertices != 0))) {
        *(undefined4 *)((long)((long)this_00 + 0xb0) + lVar41) =
             *(undefined4 *)((long)in_mesh->mNumUVComponents + lVar41);
        pvVar31 = operator_new__(uVar44);
        if (uVar26 != 0) {
          memset(pvVar31,0,uVar44 - (uVar44 - 0xc) % 0xc);
        }
        *(void **)((long)((long)this_00 + 0x70) + lVar41 * 2) = pvVar31;
        lVar41 = lVar41 + 4;
      }
      std::vector<aiFace,_std::allocator<aiFace>_>::reserve
                (&vFaces,(ulong)(uint)((int)(uVar6 >> 3) + (int)uVar6));
      do {
        if (in_mesh->mNumFaces <= uVar38) break;
        uVar25 = in_mesh->mFaces[uVar38].mNumIndices;
        uVar45 = (ulong)uVar25;
        iVar40 = 0;
        for (uVar44 = 0; uVar45 != uVar44; uVar44 = uVar44 + 1) {
          iVar40 = iVar40 + (uint)(was_copied_to.
                                   super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                   _M_impl.super__Vector_impl_data._M_start
                                   [in_mesh->mFaces[uVar38].mIndices[uVar44]] == 0xffffffff);
        }
        if (uVar26 < iVar40 + *(uint *)((long)this_00 + 4)) break;
        local_438 = (undefined1  [8])((ulong)local_438 & 0xffffffff00000000);
        local_430 = (uint *)0x0;
        std::vector<aiFace,_std::allocator<aiFace>_>::emplace_back<aiFace>
                  (&vFaces,(aiFace *)local_438);
        aiFace::~aiFace((aiFace *)local_438);
        paVar22 = vFaces.super__Vector_base<aiFace,_std::allocator<aiFace>_>._M_impl.
                  super__Vector_impl_data._M_finish;
        vFaces.super__Vector_base<aiFace,_std::allocator<aiFace>_>._M_impl.super__Vector_impl_data.
        _M_finish[-1].mNumIndices = uVar25;
        puVar32 = (uint *)operator_new__(uVar45 * 4);
        paVar22[-1].mIndices = puVar32;
        uVar37 = paVar22[-1].mNumIndices - 1;
        uVar25 = 8;
        if (uVar37 < 3) {
          uVar25 = *(uint *)(&DAT_005c8340 + (ulong)uVar37 * 4);
        }
        *(uint *)this_00 = uVar25 | *(uint *)this_00;
        for (uVar44 = 0; uVar44 != uVar45; uVar44 = uVar44 + 1) {
          uVar25 = in_mesh->mFaces[uVar38].mIndices[uVar44];
          if (was_copied_to.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_start[uVar25] == 0xffffffff) {
            paVar30 = in_mesh->mVertices;
            paVar3 = *(aiVector3D **)((long)this_00 + 0x10);
            uVar37 = *(uint *)((long)this_00 + 4);
            paVar3[uVar37].z = paVar30[uVar25].z;
            paVar30 = paVar30 + uVar25;
            fVar7 = paVar30->y;
            paVar3 = paVar3 + uVar37;
            paVar3->x = paVar30->x;
            paVar3->y = fVar7;
            paVar30 = in_mesh->mNormals;
            if ((paVar30 != (aiVector3D *)0x0) && (in_mesh->mNumVertices != 0)) {
              paVar3 = *(aiVector3D **)((long)this_00 + 0x18);
              uVar37 = *(uint *)((long)this_00 + 4);
              paVar3[uVar37].z = paVar30[uVar25].z;
              fVar7 = paVar30[uVar25].y;
              paVar3 = paVar3 + uVar37;
              paVar3->x = paVar30[uVar25].x;
              paVar3->y = fVar7;
            }
            bVar24 = aiMesh::HasTangentsAndBitangents(in_mesh);
            if (bVar24) {
              paVar30 = in_mesh->mTangents;
              paVar3 = *(aiVector3D **)((long)this_00 + 0x20);
              uVar37 = *(uint *)((long)this_00 + 4);
              paVar3[uVar37].z = paVar30[uVar25].z;
              paVar30 = paVar30 + uVar25;
              fVar7 = paVar30->y;
              paVar3 = paVar3 + uVar37;
              paVar3->x = paVar30->x;
              paVar3->y = fVar7;
              paVar30 = in_mesh->mBitangents;
              paVar3 = *(aiVector3D **)((long)this_00 + 0x28);
              uVar37 = *(uint *)((long)this_00 + 4);
              paVar3[uVar37].z = paVar30[uVar25].z;
              paVar30 = paVar30 + uVar25;
              fVar7 = paVar30->y;
              paVar3 = paVar3 + uVar37;
              paVar3->x = paVar30->x;
              paVar3->y = fVar7;
            }
            for (lVar41 = 0; lVar41 != 8; lVar41 = lVar41 + 1) {
              paVar30 = in_mesh->mTextureCoords[lVar41];
              if ((paVar30 != (aiVector3D *)0x0) && (in_mesh->mNumVertices != 0)) {
                paVar3 = ((aiVector3D **)((long)this_00 + 0x70))[lVar41];
                uVar37 = *(uint *)((long)this_00 + 4);
                paVar3[uVar37].z = paVar30[uVar25].z;
                fVar7 = paVar30[uVar25].y;
                paVar3 = paVar3 + uVar37;
                paVar3->x = paVar30[uVar25].x;
                paVar3->y = fVar7;
              }
            }
            for (lVar41 = 0; lVar41 != 8; lVar41 = lVar41 + 1) {
              if ((in_mesh->mColors[lVar41] != (aiColor4D *)0x0) && (in_mesh->mNumVertices != 0)) {
                paVar1 = in_mesh->mColors[lVar41] + uVar25;
                fVar7 = paVar1->g;
                fVar8 = paVar1->b;
                fVar9 = paVar1->a;
                paVar2 = ((aiColor4D **)((long)this_00 + 0x30))[lVar41] +
                         *(uint *)((long)this_00 + 4);
                paVar2->r = paVar1->r;
                paVar2->g = fVar7;
                paVar2->b = fVar8;
                paVar2->a = fVar9;
              }
            }
            uVar37 = *(uint *)((long)this_00 + 4);
            paVar22[-1].mIndices[uVar44] = uVar37;
            if (pVVar27 != (VertexWeightTable *)0x0) {
              ppVar4 = pVVar27[uVar37].
                       super__Vector_base<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish;
              for (ppVar42 = pVVar27[uVar37].
                             super__Vector_base<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>
                             ._M_impl.super__Vector_impl_data._M_start; ppVar42 != ppVar4;
                  ppVar42 = ppVar42 + 1) {
                ppaVar28 = *(aiBone ***)((long)this_00 + 0xe0);
                paVar33 = ppaVar28[ppVar42->first];
                if (paVar33 == (aiBone *)0x0) {
                  paVar33 = (aiBone *)operator_new(0x18);
                  (paVar33->mName).data[0xc] = '\0';
                  (paVar33->mName).data[0xd] = '\0';
                  (paVar33->mName).data[0xe] = '\0';
                  (paVar33->mName).data[0xf] = '\0';
                  (paVar33->mName).data[0x10] = '\0';
                  (paVar33->mName).data[0x11] = '\0';
                  (paVar33->mName).data[0x12] = '\0';
                  (paVar33->mName).data[0x13] = '\0';
                  (paVar33->mName).length = 0;
                  (paVar33->mName).data[0] = '\0';
                  (paVar33->mName).data[1] = '\0';
                  (paVar33->mName).data[2] = '\0';
                  (paVar33->mName).data[3] = '\0';
                  (paVar33->mName).data[4] = '\0';
                  (paVar33->mName).data[5] = '\0';
                  (paVar33->mName).data[6] = '\0';
                  (paVar33->mName).data[7] = '\0';
                  (paVar33->mName).data[8] = '\0';
                  (paVar33->mName).data[9] = '\0';
                  (paVar33->mName).data[10] = '\0';
                  (paVar33->mName).data[0xb] = '\0';
                  ppaVar28[ppVar42->first] = paVar33;
                }
                local_438._4_4_ = ppVar42->second;
                local_438._0_4_ = *(uint *)((long)this_00 + 4);
                std::vector<aiVertexWeight,_std::allocator<aiVertexWeight>_>::
                emplace_back<aiVertexWeight>
                          ((vector<aiVertexWeight,_std::allocator<aiVertexWeight>_> *)paVar33,
                           (aiVertexWeight *)local_438);
              }
              uVar37 = *(uint *)((long)this_00 + 4);
            }
            was_copied_to.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_start[uVar25] = uVar37;
            *(uint *)((long)this_00 + 4) = *(uint *)((long)this_00 + 4) + 1;
          }
          else {
            paVar22[-1].mIndices[uVar44] =
                 was_copied_to.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                 _M_impl.super__Vector_impl_data._M_start[uVar25];
          }
        }
        uVar38 = uVar38 + 1;
      } while (*(uint *)((long)this_00 + 4) != uVar26);
      uVar26 = in_mesh->mNumBones;
      if (uVar26 != 0 && in_mesh->mBones != (aiBone **)0x0) {
        local_4b0 = *(aiBone ***)((long)this_00 + 0xe0);
        for (uVar44 = 0; uVar44 < uVar26; uVar44 = uVar44 + 1) {
          paVar33 = (*(aiBone ***)((long)this_00 + 0xe0))[uVar44];
          if (paVar33 != (aiBone *)0x0) {
            paVar5 = in_mesh->mBones[uVar44];
            this_01 = (aiBone *)operator_new(0x460);
            aiBone::aiBone(this_01);
            *local_4b0 = this_01;
            uVar26 = (paVar5->mName).length;
            if (0x3fe < uVar26) {
              uVar26 = 0x3ff;
            }
            uVar45 = (ulong)uVar26;
            local_438._0_4_ = uVar26;
            memcpy(local_438 + 4,(paVar5->mName).data,uVar45);
            local_438[uVar45 + 4] = 0;
            (this_01->mName).length = uVar26;
            memcpy((this_01->mName).data,local_438 + 4,uVar45);
            (this_01->mName).data[uVar45] = '\0';
            fVar18 = (paVar5->mOffsetMatrix).a1;
            fVar19 = (paVar5->mOffsetMatrix).a2;
            fVar20 = (paVar5->mOffsetMatrix).a3;
            fVar21 = (paVar5->mOffsetMatrix).a4;
            fVar14 = (paVar5->mOffsetMatrix).b1;
            fVar15 = (paVar5->mOffsetMatrix).b2;
            fVar16 = (paVar5->mOffsetMatrix).b3;
            fVar17 = (paVar5->mOffsetMatrix).b4;
            fVar10 = (paVar5->mOffsetMatrix).c1;
            fVar11 = (paVar5->mOffsetMatrix).c2;
            fVar12 = (paVar5->mOffsetMatrix).c3;
            fVar13 = (paVar5->mOffsetMatrix).c4;
            fVar7 = (paVar5->mOffsetMatrix).d2;
            fVar8 = (paVar5->mOffsetMatrix).d3;
            fVar9 = (paVar5->mOffsetMatrix).d4;
            (this_01->mOffsetMatrix).d1 = (paVar5->mOffsetMatrix).d1;
            (this_01->mOffsetMatrix).d2 = fVar7;
            (this_01->mOffsetMatrix).d3 = fVar8;
            (this_01->mOffsetMatrix).d4 = fVar9;
            (this_01->mOffsetMatrix).c1 = fVar10;
            (this_01->mOffsetMatrix).c2 = fVar11;
            (this_01->mOffsetMatrix).c3 = fVar12;
            (this_01->mOffsetMatrix).c4 = fVar13;
            (this_01->mOffsetMatrix).b1 = fVar14;
            (this_01->mOffsetMatrix).b2 = fVar15;
            (this_01->mOffsetMatrix).b3 = fVar16;
            (this_01->mOffsetMatrix).b4 = fVar17;
            (this_01->mOffsetMatrix).a1 = fVar18;
            (this_01->mOffsetMatrix).a2 = fVar19;
            (this_01->mOffsetMatrix).a3 = fVar20;
            (this_01->mOffsetMatrix).a4 = fVar21;
            uVar43 = (long)*(pointer *)((paVar33->mName).data + 4) - *(long *)&paVar33->mName;
            uVar34 = (long)uVar43 >> 3;
            this_01->mNumWeights = (uint)uVar34;
            uVar34 = uVar34 & 0xffffffff;
            uVar45 = uVar34 * 8;
            __s = (aiVertexWeight *)operator_new__(uVar45);
            if (uVar34 != 0) {
              memset(__s,0,uVar45);
            }
            local_4b0 = local_4b0 + 1;
            this_01->mWeights = __s;
            memcpy(__s,*(void **)&paVar33->mName,uVar43 & 0x7fffffff8);
            std::_Vector_base<aiVertexWeight,_std::allocator<aiVertexWeight>_>::~_Vector_base
                      ((_Vector_base<aiVertexWeight,_std::allocator<aiVertexWeight>_> *)paVar33);
            operator_delete(paVar33,0x18);
            *(uint *)((long)this_00 + 0xd8) = *(uint *)((long)this_00 + 0xd8) + 1;
            uVar26 = in_mesh->mNumBones;
          }
        }
      }
      paVar23 = vFaces.super__Vector_base<aiFace,_std::allocator<aiFace>_>._M_impl.
                super__Vector_impl_data._M_finish;
      paVar22 = vFaces.super__Vector_base<aiFace,_std::allocator<aiFace>_>._M_impl.
                super__Vector_impl_data._M_start;
      uVar45 = (long)vFaces.super__Vector_base<aiFace,_std::allocator<aiFace>_>._M_impl.
                     super__Vector_impl_data._M_finish -
               (long)vFaces.super__Vector_base<aiFace,_std::allocator<aiFace>_>._M_impl.
                     super__Vector_impl_data._M_start;
      uVar44 = (long)uVar45 >> 4;
      puVar35 = (ulong *)operator_new__(-(ulong)(uVar44 >> 0x3c != 0) | uVar45 | 8);
      *puVar35 = uVar44;
      paVar36 = (aiFace *)(puVar35 + 1);
      if (paVar23 != paVar22) {
        paVar39 = paVar36;
        do {
          paVar39->mNumIndices = 0;
          paVar39->mIndices = (uint *)0x0;
          paVar39 = paVar39 + 1;
        } while (paVar39 != (aiFace *)(uVar45 + (long)paVar36));
      }
      *(aiFace **)((long)this_00 + 0xd0) = paVar36;
      *(uint *)((long)this_00 + 8) = (uint)uVar44;
      lVar41 = 0;
      for (uVar45 = 0; uVar45 < (uVar44 & 0xffffffff); uVar45 = uVar45 + 1) {
        aiFace::operator=((aiFace *)
                          ((long)&(*(aiFace **)((long)this_00 + 0xd0))->mNumIndices + lVar41),
                          (aiFace *)
                          ((long)&(vFaces.super__Vector_base<aiFace,_std::allocator<aiFace>_>.
                                   _M_impl.super__Vector_impl_data._M_start)->mNumIndices + lVar41))
        ;
        uVar44 = (ulong)*(uint *)((long)this_00 + 8);
        lVar41 = lVar41 + 0x10;
      }
      local_430 = (uint *)CONCAT44(local_430._4_4_,a);
      local_438 = (undefined1  [8])this_00;
      std::vector<std::pair<aiMesh*,unsigned_int>,std::allocator<std::pair<aiMesh*,unsigned_int>>>::
      emplace_back<std::pair<aiMesh*,unsigned_int>>
                ((vector<std::pair<aiMesh*,unsigned_int>,std::allocator<std::pair<aiMesh*,unsigned_int>>>
                  *)source_mesh_map,(pair<aiMesh_*,_unsigned_int> *)local_438);
      uVar26 = in_mesh->mNumFaces;
      std::vector<aiFace,_std::allocator<aiFace>_>::~vector(&vFaces);
    } while (uVar38 != uVar26);
    if (pVVar27 != (VertexWeightTable *)0x0) {
      ppVar42 = pVVar27[-1].
                super__Vector_base<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage;
      if (ppVar42 != (pointer)0x0) {
        lVar41 = (long)ppVar42 * 0x18;
        do {
          std::
          _Vector_base<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>
          ::~_Vector_base((_Vector_base<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>
                           *)((long)&pVVar27[-1].
                                     super__Vector_base<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>
                                     ._M_impl.super__Vector_impl_data._M_start + lVar41));
          lVar41 = lVar41 + -0x18;
        } while (lVar41 != 0);
      }
      operator_delete__(&pVVar27[-1].
                         super__Vector_base<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage,(long)ppVar42 * 0x18 + 8
                       );
    }
    aiMesh::~aiMesh(in_mesh);
    operator_delete(in_mesh,0x520);
    std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
              (&was_copied_to.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>);
  }
  else {
    local_430 = (uint *)CONCAT44(local_430._4_4_,a);
    local_438 = (undefined1  [8])in_mesh;
    std::vector<std::pair<aiMesh*,unsigned_int>,std::allocator<std::pair<aiMesh*,unsigned_int>>>::
    emplace_back<std::pair<aiMesh*,unsigned_int>>
              ((vector<std::pair<aiMesh*,unsigned_int>,std::allocator<std::pair<aiMesh*,unsigned_int>>>
                *)source_mesh_map,(pair<aiMesh_*,_unsigned_int> *)local_438);
  }
  return;
}

Assistant:

void MeshSplitter :: SplitMesh(unsigned int a, aiMesh* in_mesh, std::vector<std::pair<aiMesh*, unsigned int> >& source_mesh_map) {
	// TODO: should better use std::(multi)set for source_mesh_map.

	if (in_mesh->mNumVertices <= LIMIT)	{
		source_mesh_map.push_back(std::make_pair(in_mesh,a));
		return;
	}

	// build a per-vertex weight list if necessary
	VertexWeightTable* avPerVertexWeights = ComputeVertexBoneWeightTable(in_mesh);

	// we need to split this mesh into sub meshes. Estimate submesh size
	const unsigned int sub_meshes = (in_mesh->mNumVertices / LIMIT) + 1;

	// create a std::vector<unsigned int> to remember which vertices have already 
	// been copied and to which position (i.e. output index)
	std::vector<unsigned int> was_copied_to;
	was_copied_to.resize(in_mesh->mNumVertices,WAS_NOT_COPIED);

	// Try to find a good estimate for the number of output faces
	// per mesh. Add 12.5% as buffer
	unsigned int size_estimated = in_mesh->mNumFaces / sub_meshes;
	size_estimated += size_estimated / 8;

	// now generate all submeshes
	unsigned int base = 0;
	while (true) {
		const unsigned int out_vertex_index = LIMIT;

		aiMesh* out_mesh = new aiMesh();			
		out_mesh->mNumVertices = 0;
		out_mesh->mMaterialIndex = in_mesh->mMaterialIndex;

		// the name carries the adjacency information between the meshes
		out_mesh->mName = in_mesh->mName;

		typedef std::vector<aiVertexWeight> BoneWeightList;
		if (in_mesh->HasBones())	{
			out_mesh->mBones = new aiBone*[in_mesh->mNumBones]();
		}

		// clear the temporary helper array
		if (base)	{
			std::fill(was_copied_to.begin(), was_copied_to.end(), WAS_NOT_COPIED);
		}

		std::vector<aiFace> vFaces;

		// reserve enough storage for most cases
		if (in_mesh->HasPositions()) {
			out_mesh->mVertices = new aiVector3D[out_vertex_index];
		}

		if (in_mesh->HasNormals()) {
			out_mesh->mNormals = new aiVector3D[out_vertex_index];
		}

		if (in_mesh->HasTangentsAndBitangents())	{
			out_mesh->mTangents = new aiVector3D[out_vertex_index];
			out_mesh->mBitangents = new aiVector3D[out_vertex_index];
		}

		for (unsigned int c = 0; in_mesh->HasVertexColors(c);++c)	{
			out_mesh->mColors[c] = new aiColor4D[out_vertex_index];
		}

		for (unsigned int c = 0; in_mesh->HasTextureCoords(c);++c)	{
			out_mesh->mNumUVComponents[c] = in_mesh->mNumUVComponents[c];
			out_mesh->mTextureCoords[c] = new aiVector3D[out_vertex_index];
		}
		vFaces.reserve(size_estimated);

		// (we will also need to copy the array of indices)
		while (base < in_mesh->mNumFaces) {
			const unsigned int iNumIndices = in_mesh->mFaces[base].mNumIndices;

			// doesn't catch degenerates but is quite fast
			unsigned int iNeed = 0;
			for (unsigned int v = 0; v < iNumIndices;++v)	{
				unsigned int index = in_mesh->mFaces[base].mIndices[v];

				// check whether we do already have this vertex
				if (WAS_NOT_COPIED == was_copied_to[index])	{
					iNeed++; 
				}
			}
			if (out_mesh->mNumVertices + iNeed > out_vertex_index)	{
				// don't use this face
				break;
			}

			vFaces.push_back(aiFace());
			aiFace& rFace = vFaces.back();

			// setup face type and number of indices
			rFace.mNumIndices = iNumIndices;
			rFace.mIndices = new unsigned int[iNumIndices];

			// need to update the output primitive types
			switch (rFace.mNumIndices)
			{
			case 1:
				out_mesh->mPrimitiveTypes |= aiPrimitiveType_POINT;
				break;
			case 2:
				out_mesh->mPrimitiveTypes |= aiPrimitiveType_LINE;
				break;
			case 3:
				out_mesh->mPrimitiveTypes |= aiPrimitiveType_TRIANGLE;
				break;
			default:
				out_mesh->mPrimitiveTypes |= aiPrimitiveType_POLYGON;
			}

			// and copy the contents of the old array, offset them by current base
			for (unsigned int v = 0; v < iNumIndices;++v) {
				const unsigned int index = in_mesh->mFaces[base].mIndices[v];

				// check whether we do already have this vertex
				if (WAS_NOT_COPIED != was_copied_to[index]) {
					rFace.mIndices[v] = was_copied_to[index];
					continue;
				}

				// copy positions
				out_mesh->mVertices[out_mesh->mNumVertices] = (in_mesh->mVertices[index]);

				// copy normals
				if (in_mesh->HasNormals()) {
					out_mesh->mNormals[out_mesh->mNumVertices] = (in_mesh->mNormals[index]);
				}

				// copy tangents/bi-tangents
				if (in_mesh->HasTangentsAndBitangents()) {
					out_mesh->mTangents[out_mesh->mNumVertices] = (in_mesh->mTangents[index]);
					out_mesh->mBitangents[out_mesh->mNumVertices] = (in_mesh->mBitangents[index]);
				}

				// texture coordinates
				for (unsigned int c = 0;  c < AI_MAX_NUMBER_OF_TEXTURECOORDS;++c) {
					if (in_mesh->HasTextureCoords( c)) {
						out_mesh->mTextureCoords[c][out_mesh->mNumVertices] = in_mesh->mTextureCoords[c][index];
					}
				}
				// vertex colors 
				for (unsigned int c = 0;  c < AI_MAX_NUMBER_OF_COLOR_SETS;++c) {
					if (in_mesh->HasVertexColors( c)) {
						out_mesh->mColors[c][out_mesh->mNumVertices] = in_mesh->mColors[c][index];
					}
				}
				// check whether we have bone weights assigned to this vertex
				rFace.mIndices[v] = out_mesh->mNumVertices;
				if (avPerVertexWeights) {
					VertexWeightTable& table = avPerVertexWeights[ out_mesh->mNumVertices ];
					for (VertexWeightTable::const_iterator iter = table.begin(), end = table.end(); iter != end;++iter) {
						// allocate the bone weight array if necessary and store it in the mBones field (HACK!)
						BoneWeightList* weight_list = reinterpret_cast<BoneWeightList*>(out_mesh->mBones[(*iter).first]);
						if (!weight_list) {
							weight_list = new BoneWeightList();
							out_mesh->mBones[(*iter).first] = reinterpret_cast<aiBone*>(weight_list);
						}
						weight_list->push_back(aiVertexWeight(out_mesh->mNumVertices,(*iter).second));
					}
				}

				was_copied_to[index] = out_mesh->mNumVertices;
				out_mesh->mNumVertices++;
			}
			base++;
			if(out_mesh->mNumVertices == out_vertex_index) {
				// break here. The face is only added if it was complete
				break;
			}
		}

		// check which bones we'll need to create for this submesh
		if (in_mesh->HasBones()) {
			aiBone** ppCurrent = out_mesh->mBones;
			for (unsigned int k = 0; k < in_mesh->mNumBones;++k) {
				// check whether the bone exists
				BoneWeightList* const weight_list = reinterpret_cast<BoneWeightList*>(out_mesh->mBones[k]);

				if (weight_list) {
					const aiBone* const bone_in = in_mesh->mBones[k];
					aiBone* const bone_out = new aiBone();
					*ppCurrent++ = bone_out;
					bone_out->mName = aiString(bone_in->mName);
					bone_out->mOffsetMatrix =bone_in->mOffsetMatrix;
					bone_out->mNumWeights = (unsigned int)weight_list->size();
					bone_out->mWeights = new aiVertexWeight[bone_out->mNumWeights];

					// copy the vertex weights
					::memcpy(bone_out->mWeights, &(*weight_list)[0],bone_out->mNumWeights * sizeof(aiVertexWeight));

					delete weight_list;
					out_mesh->mNumBones++;
				}
			}
		}

		// copy the face list to the mesh
		out_mesh->mFaces = new aiFace[vFaces.size()];
		out_mesh->mNumFaces = (unsigned int)vFaces.size();

		for (unsigned int p = 0; p < out_mesh->mNumFaces;++p) {
			out_mesh->mFaces[p] = vFaces[p];
		}

		// add the newly created mesh to the list
		source_mesh_map.push_back(std::make_pair(out_mesh,a));

		if (base == in_mesh->mNumFaces) {
			break;
		}
	}

	// delete the per-vertex weight list again
	delete[] avPerVertexWeights;

	// now delete the old mesh data
	delete in_mesh;
}